

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::Search(ON_RTree *this,ON_Line *a_line,bool infinite,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  ON_RTreeNode *a_node;
  bool bVar1;
  ON_RTreeSearchResultCallback result;
  ON_RTreeSearchResultCallback local_10;
  
  a_node = this->m_root;
  if (a_line == (ON_Line *)0x0 || a_node == (ON_RTreeNode *)0x0) {
    return false;
  }
  local_10.m_context = a_context;
  local_10.m_resultCallback = a_resultCallback;
  if (infinite) {
    bVar1 = SearchInfiniteLineHelper(a_node,a_line,&local_10);
  }
  else {
    bVar1 = SearchHelper(a_node,a_line,&local_10);
  }
  return bVar1;
}

Assistant:

bool ON_RTree::Search(
  const ON_Line* a_line,
  bool infinite,
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_data),
  void* a_context
) const
{
  if (0 == m_root || 0 == a_line)
    return false;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;
  if (infinite)
    return SearchInfiniteLineHelper(m_root, a_line, result);
  else
    return SearchHelper(m_root, a_line, result);
}